

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

void xmlTextReaderFreeNodeList(xmlTextReaderPtr reader,xmlNodePtr cur)

{
  _xmlNode *p_Var1;
  _xmlNode *p_Var2;
  int iVar3;
  xmlDeregisterNodeFunc *pp_Var4;
  bool bVar5;
  long local_38;
  size_t depth;
  xmlDictPtr dict;
  xmlNodePtr parent;
  xmlNodePtr next;
  xmlNodePtr cur_local;
  xmlTextReaderPtr reader_local;
  
  local_38 = 0;
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->ctxt == (xmlParserCtxtPtr)0x0)) {
    depth = 0;
  }
  else {
    depth = (size_t)reader->ctxt->dict;
  }
  if (cur != (xmlNodePtr)0x0) {
    if (cur->type == XML_NAMESPACE_DECL) {
      xmlFreeNsList((xmlNsPtr)cur);
    }
    else if ((cur->type == XML_DOCUMENT_NODE) || (next = cur, cur->type == XML_HTML_DOCUMENT_NODE))
    {
      xmlFreeDoc((xmlDocPtr)cur);
    }
    else {
      while( true ) {
        do {
          while( true ) {
            bVar5 = false;
            if ((next->type != XML_DTD_NODE) &&
               ((bVar5 = false, next->type != XML_ENTITY_REF_NODE &&
                (bVar5 = false, next->children != (_xmlNode *)0x0)))) {
              bVar5 = next->children->parent == next;
            }
            if (!bVar5) break;
            local_38 = local_38 + 1;
            next = next->children;
          }
          p_Var1 = next->next;
          p_Var2 = next->parent;
          if (next->type != XML_DTD_NODE) {
            if ((xmlRegisterCallbacks != 0) &&
               (pp_Var4 = __xmlDeregisterNodeDefaultValue(), *pp_Var4 != (xmlDeregisterNodeFunc)0x0)
               ) {
              pp_Var4 = __xmlDeregisterNodeDefaultValue();
              (**pp_Var4)(next);
            }
            if ((((next->type == XML_ELEMENT_NODE) || (next->type == XML_XINCLUDE_START)) ||
                (next->type == XML_XINCLUDE_END)) && (next->properties != (_xmlAttr *)0x0)) {
              xmlTextReaderFreePropList(reader,next->properties);
            }
            if ((((((_xmlAttr **)next->content != &next->properties) &&
                  (next->type != XML_ELEMENT_NODE)) &&
                 ((next->type != XML_XINCLUDE_START &&
                  ((next->type != XML_XINCLUDE_END && (next->type != XML_ENTITY_REF_NODE)))))) &&
                (next->content != (xmlChar *)0x0)) &&
               ((depth == 0 || (iVar3 = xmlDictOwns((xmlDictPtr)depth,next->content), iVar3 == 0))))
            {
              (*xmlFree)(next->content);
            }
            if ((((next->type == XML_ELEMENT_NODE) || (next->type == XML_XINCLUDE_START)) ||
                (next->type == XML_XINCLUDE_END)) && (next->nsDef != (xmlNs *)0x0)) {
              xmlFreeNsList(next->nsDef);
            }
            if (((next->type != XML_TEXT_NODE) && (next->type != XML_COMMENT_NODE)) &&
               ((next->name != (xmlChar *)0x0 &&
                ((depth == 0 || (iVar3 = xmlDictOwns((xmlDictPtr)depth,next->name), iVar3 == 0))))))
            {
              (*xmlFree)(next->name);
            }
            if ((((next->type == XML_ELEMENT_NODE) || (next->type == XML_TEXT_NODE)) &&
                (reader != (xmlTextReaderPtr)0x0)) &&
               ((reader->ctxt != (xmlParserCtxtPtr)0x0 && (reader->ctxt->freeElemsNr < 100)))) {
              next->next = reader->ctxt->freeElems;
              reader->ctxt->freeElems = next;
              reader->ctxt->freeElemsNr = reader->ctxt->freeElemsNr + 1;
            }
            else {
              (*xmlFree)(next);
            }
          }
          next = p_Var1;
        } while (p_Var1 != (_xmlNode *)0x0);
        if ((local_38 == 0) || (p_Var2 == (_xmlNode *)0x0)) break;
        local_38 = local_38 + -1;
        p_Var2->children = (_xmlNode *)0x0;
        next = p_Var2;
      }
    }
  }
  return;
}

Assistant:

static void
xmlTextReaderFreeNodeList(xmlTextReaderPtr reader, xmlNodePtr cur) {
    xmlNodePtr next;
    xmlNodePtr parent;
    xmlDictPtr dict;
    size_t depth = 0;

    if ((reader != NULL) && (reader->ctxt != NULL))
	dict = reader->ctxt->dict;
    else
        dict = NULL;
    if (cur == NULL) return;
    if (cur->type == XML_NAMESPACE_DECL) {
	xmlFreeNsList((xmlNsPtr) cur);
	return;
    }
    if ((cur->type == XML_DOCUMENT_NODE) ||
	(cur->type == XML_HTML_DOCUMENT_NODE)) {
	xmlFreeDoc((xmlDocPtr) cur);
	return;
    }
    while (1) {
        while ((cur->type != XML_DTD_NODE) &&
               (cur->type != XML_ENTITY_REF_NODE) &&
               (cur->children != NULL) &&
               (cur->children->parent == cur)) {
            cur = cur->children;
            depth += 1;
        }

        next = cur->next;
        parent = cur->parent;

	/* unroll to speed up freeing the document */
	if (cur->type != XML_DTD_NODE) {

	    if ((xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
		xmlDeregisterNodeDefaultValue(cur);

	    if (((cur->type == XML_ELEMENT_NODE) ||
		 (cur->type == XML_XINCLUDE_START) ||
		 (cur->type == XML_XINCLUDE_END)) &&
		(cur->properties != NULL))
		xmlTextReaderFreePropList(reader, cur->properties);
	    if ((cur->content != (xmlChar *) &(cur->properties)) &&
	        (cur->type != XML_ELEMENT_NODE) &&
		(cur->type != XML_XINCLUDE_START) &&
		(cur->type != XML_XINCLUDE_END) &&
		(cur->type != XML_ENTITY_REF_NODE)) {
		DICT_FREE(cur->content);
	    }
	    if (((cur->type == XML_ELEMENT_NODE) ||
	         (cur->type == XML_XINCLUDE_START) ||
		 (cur->type == XML_XINCLUDE_END)) &&
		(cur->nsDef != NULL))
		xmlFreeNsList(cur->nsDef);

	    /*
	     * we don't free element names here they are interned now
	     */
	    if ((cur->type != XML_TEXT_NODE) &&
		(cur->type != XML_COMMENT_NODE))
		DICT_FREE(cur->name);
	    if (((cur->type == XML_ELEMENT_NODE) ||
		 (cur->type == XML_TEXT_NODE)) &&
	        (reader != NULL) && (reader->ctxt != NULL) &&
		(reader->ctxt->freeElemsNr < MAX_FREE_NODES)) {
	        cur->next = reader->ctxt->freeElems;
		reader->ctxt->freeElems = cur;
		reader->ctxt->freeElemsNr++;
	    } else {
		xmlFree(cur);
	    }
	}

        if (next != NULL) {
	    cur = next;
        } else {
            if ((depth == 0) || (parent == NULL))
                break;
            depth -= 1;
            cur = parent;
            cur->children = NULL;
        }
    }
}